

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O3

wchar_t borg_best_mult(borg_item *obj,monster_race *r_ptr)

{
  int flag;
  slay_conflict *psVar1;
  brand_conflict *pbVar2;
  _Bool _Var3;
  _Bool *p_Var4;
  wchar_t *pwVar5;
  wchar_t wVar6;
  ulong uVar7;
  long lVar8;
  wchar_t wVar9;
  
  wVar6 = L'\x01';
  if (1 < z_info->brand_max) {
    p_Var4 = obj->brands;
    uVar7 = 1;
    lVar8 = 0x58;
    do {
      pbVar2 = brands;
      p_Var4 = p_Var4 + 1;
      if ((obj == (borg_item *)0x0) || (obj->iqty == '\0')) {
        _Var3 = player_has_temporary_brand(player,(wchar_t)uVar7);
        if (_Var3) goto LAB_0020f3a2;
      }
      else if (*p_Var4 != false) {
LAB_0020f3a2:
        _Var3 = flag_has_dbg(r_ptr->flags,0xb,*(int *)((long)pbVar2 + lVar8 + -8),"r_ptr->flags",
                             "brand->resist_flag");
        if (!_Var3) {
          flag = *(int *)((long)pbVar2 + lVar8 + -4);
          wVar9 = *(wchar_t *)((long)&pbVar2->code + lVar8);
          if (flag != 0) {
            _Var3 = flag_has_dbg(r_ptr->flags,0xb,flag,"r_ptr->flags","brand->vuln_flag");
            wVar9 = wVar9 << _Var3;
          }
          if (wVar6 < wVar9) {
            wVar6 = wVar9;
          }
        }
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x38;
    } while (uVar7 < z_info->brand_max);
  }
  if (1 < z_info->slay_max) {
    pwVar5 = obj->slays;
    uVar7 = 1;
    lVar8 = 0x1b;
    do {
      psVar1 = slays;
      pwVar5 = pwVar5 + 1;
      if ((obj == (borg_item *)0x0) || (obj->iqty == '\0')) {
        _Var3 = player_has_temporary_slay(player,(wchar_t)uVar7);
        if (_Var3) goto LAB_0020f475;
      }
      else if (*pwVar5 != L'\0') {
LAB_0020f475:
        _Var3 = flag_has_dbg(r_ptr->flags,0xb,*(int *)((long)psVar1 + lVar8 * 4 + -4),"r_ptr->flags"
                             ,"slay->race_flag");
        if ((_Var3) && (wVar9 = *(wchar_t *)((long)&psVar1->code + lVar8 * 4), wVar6 < wVar9)) {
          wVar6 = wVar9;
        }
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < z_info->slay_max);
  }
  return wVar6;
}

Assistant:

static int borg_best_mult(borg_item *obj, struct monster_race *r_ptr)
{
    int i;
    int max_mult = 1;

    /* Brands */
    for (i = 1; i < z_info->brand_max; i++) {
        struct brand *brand = &brands[i];
        if (obj && obj->iqty) {
            /* Brand is on an object */
            if (!obj->brands[i])
                continue;
        } else {
            /* Temporary brand */
            if (!player_has_temporary_brand(player, i))
                continue;
        }

        /* Is the monster vulnerable? */
        if (!rf_has(r_ptr->flags, brand->resist_flag)) {
            int mult = brand->multiplier;
            if (brand->vuln_flag && rf_has(r_ptr->flags, brand->vuln_flag)) {
                mult *= 2;
            }
            max_mult = MAX(mult, max_mult);
        }
    }

    /* Slays */
    for (i = 1; i < z_info->slay_max; i++) {
        struct slay *slay = &slays[i];
        if (obj && obj->iqty) {
            /* Slay is on an object */
            if (!obj->slays[i])
                continue;
        } else {
            /* Temporary slay */
            if (!player_has_temporary_slay(player, i))
                continue;
        }

        if (rf_has(r_ptr->flags, slay->race_flag)) {
            max_mult = MAX(slay->multiplier, max_mult);
        }
    }
    return max_mult;
}